

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.c
# Opt level: O0

void LoadFunction(LoadState *S,Proto *f)

{
  int iVar1;
  Proto *f_local;
  LoadState *S_local;
  
  iVar1 = LoadInt(S);
  f->linedefined = iVar1;
  iVar1 = LoadInt(S);
  f->lastlinedefined = iVar1;
  iVar1 = LoadChar(S);
  f->numparams = (lu_byte)iVar1;
  iVar1 = LoadChar(S);
  f->is_vararg = (lu_byte)iVar1;
  iVar1 = LoadChar(S);
  f->maxstacksize = (lu_byte)iVar1;
  LoadCode(S,f);
  LoadConstants(S,f);
  LoadUpvalues(S,f);
  LoadDebug(S,f);
  return;
}

Assistant:

static void LoadFunction(LoadState* S, Proto* f)
{
 f->linedefined=LoadInt(S);
 f->lastlinedefined=LoadInt(S);
 f->numparams=LoadByte(S);
 f->is_vararg=LoadByte(S);
 f->maxstacksize=LoadByte(S);
 LoadCode(S,f);
 LoadConstants(S,f);
 LoadUpvalues(S,f);
 LoadDebug(S,f);
}